

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result spvc_compiler_mask_stage_output_by_builtin(spvc_compiler compiler,SpvBuiltIn builtin)

{
  spvc_context_s *this;
  spvc_result sVar1;
  allocator local_31;
  string local_30;
  
  if (compiler->backend == SPVC_BACKEND_NONE) {
    this = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_30,
               "Cross-compilation related option used on NONE backend which only supports reflection."
               ,&local_31);
    spvc_context_s::report_error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  else {
    spirv_cross::CompilerGLSL::mask_stage_output_by_builtin
              ((CompilerGLSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,builtin);
    sVar1 = SPVC_SUCCESS;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_mask_stage_output_by_builtin(spvc_compiler compiler, SpvBuiltIn builtin)
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend == SPVC_BACKEND_NONE)
	{
		compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	static_cast<CompilerGLSL *>(compiler->compiler.get())->mask_stage_output_by_builtin(spv::BuiltIn(builtin));
	return SPVC_SUCCESS;
#else
	(void)builtin;
	compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}